

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O1

int helicsEndpointGetOption(HelicsEndpoint end,int option)

{
  int iVar1;
  undefined8 *puVar2;
  
  iVar1 = 0;
  puVar2 = (undefined8 *)0x0;
  if ((end != (HelicsEndpoint)0x0) && (*(int *)((long)end + 0x20) == -0x4bac6b3e)) {
    puVar2 = (undefined8 *)end;
  }
  if (puVar2 != (undefined8 *)0x0) {
    iVar1 = (**(code **)(*(long *)*puVar2 + 0x18))();
  }
  return iVar1;
}

Assistant:

int helicsEndpointGetOption(HelicsEndpoint end, int option)
{
    auto* endObj = verifyEndpoint(end, nullptr);
    if (endObj == nullptr) {
        return HELICS_FALSE;
    }
    try {
        return endObj->endPtr->getOption(option);
    }
    // LCOV_EXCL_START
    catch (...) {
        return HELICS_FALSE;
    }
    // LCOV_EXCL_STOP
}